

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O2

sexp_conflict
utf16_2_str(sexp_conflict ctx,char *bv,int len,sexp_conflict endianness,int endianness_mandatory)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  sexp_conflict psVar5;
  long lVar6;
  ushort uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uchar *p;
  bool bVar12;
  
  bVar12 = (((ctx->value).type.setters)->value).type.slots != endianness;
  if (1 < len && endianness_mandatory == 0) {
    lVar10 = 2;
    if (*(short *)bv == -2) {
      bVar12 = true;
      goto LAB_001024a8;
    }
    if (*(short *)bv == -0x101) goto LAB_001024a8;
  }
  lVar10 = 0;
LAB_001024a8:
  lVar1 = (long)len + -1;
  lVar11 = (long)len + -3;
  lVar4 = 0;
  for (lVar6 = lVar10; lVar6 < lVar1; lVar6 = lVar6 + 2) {
    uVar2 = *(ushort *)(bv + lVar6);
    uVar7 = uVar2 << 8 | uVar2 >> 8;
    if (!bVar12) {
      uVar7 = uVar2;
    }
    if (lVar6 < lVar11 && (uVar7 & 0xfc00) == 0xd800) {
      uVar2 = *(ushort *)(bv + lVar6 + 2);
      uVar3 = uVar2 << 8 | uVar2 >> 8;
      if (!bVar12) {
        uVar3 = uVar2;
      }
      if ((uVar3 & 0xfc00) == 0xdc00) {
        uVar7 = uVar7 * 0x400 + uVar3 + 0x2400;
        lVar6 = lVar6 + 2;
      }
    }
    lVar8 = 3 - (ulong)(uVar7 < 0x800);
    if (uVar7 < 0x80) {
      lVar8 = 1;
    }
    lVar4 = lVar4 + lVar8;
  }
  psVar5 = (sexp_conflict)sexp_make_string_op(ctx,0,2,lVar4 * 2 + 1,0x43e);
  if ((((ulong)psVar5 & 3) == 0 && psVar5 != (sexp_conflict)0x0) && (psVar5->tag == 9)) {
    p = (uchar *)((((psVar5->value).type.cpl)->value).flonum_bits +
                 (long)(((psVar5->value).type.name)->value).flonum_bits);
    for (; lVar10 < lVar1; lVar10 = lVar10 + 2) {
      uVar2 = *(ushort *)(bv + lVar10);
      uVar7 = uVar2 << 8 | uVar2 >> 8;
      if (!bVar12) {
        uVar7 = uVar2;
      }
      if (lVar10 < lVar11 && (uVar7 & 0xfc00) == 0xd800) {
        uVar2 = *(ushort *)(bv + lVar10 + 2);
        uVar3 = uVar2 << 8 | uVar2 >> 8;
        if (!bVar12) {
          uVar3 = uVar2;
        }
        if ((uVar3 & 0xfc00) == 0xdc00) {
          uVar7 = uVar7 * 0x400 + uVar3 + 0x2400;
          lVar10 = lVar10 + 2;
        }
      }
      uVar9 = (ulong)(3 - (uVar7 < 0x800));
      if (uVar7 < 0x80) {
        uVar9 = 1;
      }
      utf8_encode_char(p,(int)uVar9,(uint)uVar7);
      p = p + uVar9;
    }
  }
  return psVar5;
}

Assistant:

sexp utf16_2_str(sexp ctx, char* bv, int len, sexp endianness, int endianness_mandatory) {
  int swap = endianness != sexp_global(ctx, SEXP_G_ENDIANNESS);
  uint16_t ch, ch2;
  sexp_sint_t i, ch_len, utf8_len=0, start=0;
  sexp res;
  unsigned char* dst;
  if (!endianness_mandatory && len>1) {
    ch = *(uint16_t*)(bv);
    if (ch == 0xFFFE) {
      swap = 1;
      start = 2;
    } else if (ch == 0xFEFF) {
      start = 2;
    }
  }
  for (i=start; i+1<len; i+=2) {
    ch = swap ? sexp_swap_u16(*((uint16_t*)(bv+i))) : *((uint16_t*)(bv+i));
    if (0xd800 <= ch && ch <= 0xdbff && i+3<len) {
      ch2 = swap ? sexp_swap_u16(*((uint16_t*)(bv+i+2))) : *((uint16_t*)(bv+i+2));
      if (0xdc00 <= ch2 && ch2 <= 0xdfff) {
        ch = 0x10000 + (((ch - 0xd800) << 10) | (ch2 - 0xdc00));
        i += 2;
      }
    }
    utf8_len += utf8_char_byte_count(ch);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(utf8_len), SEXP_VOID);
  if (!(res && sexp_stringp(res))) return res;
  dst = (unsigned char*) sexp_string_data(res);
  for (i=start; i+1<len; i+=2) {
    ch = swap ? sexp_swap_u16(*((uint16_t*)(bv+i))) : *((uint16_t*)(bv+i));
    if (0xd800 <= ch && ch <= 0xdbff && i+3<len) {
      ch2 = swap ? sexp_swap_u16(*((uint16_t*)(bv+i+2))) : *((uint16_t*)(bv+i+2));
      if (0xdc00 <= ch2 && ch2 <= 0xdfff) {
        ch = 0x10000 + (((ch - 0xd800) << 10) | (ch2 - 0xdc00));
        i += 2;
      }
    }
    ch_len = utf8_char_byte_count(ch);
    utf8_encode_char(dst, ch_len, ch);
    dst += ch_len;
  }
  return res;
}